

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O2

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = (char *)(result->file_name_)._M_string_length;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (result->file_name_)._M_dataplus._M_p;
  }
  poVar1 = std::operator<<(os,pcVar3);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,result->line_number_);
  poVar1 = std::operator<<(poVar1,": ");
  pcVar3 = "Non-fatal failure";
  if (result->type_ == kFatalFailure) {
    pcVar3 = "Fatal failure";
  }
  pcVar2 = "Success";
  if (result->type_ != kSuccess) {
    pcVar2 = pcVar3;
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,":\n");
  poVar1 = std::operator<<(poVar1,(result->message_)._M_dataplus._M_p);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os
      << result.file_name() << ":" << result.line_number() << ": "
      << (result.type() == TestPartResult::kSuccess ? "Success" :
          result.type() == TestPartResult::kFatalFailure ? "Fatal failure" :
          "Non-fatal failure") << ":\n"
      << result.message() << std::endl;
}